

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfFunctionBlocker::ShouldRemove
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  bool bVar1;
  int iVar2;
  char *l;
  cmMakefile *param_2_local;
  cmListFileFunction *lff_local;
  cmIfFunctionBlocker *this_local;
  
  l = (char *)std::__cxx11::string::c_str();
  iVar2 = cmsys::SystemTools::Strucmp(l,"endif");
  if ((iVar2 == 0) &&
     ((bVar1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::empty
                         (&lff->Arguments), bVar1 ||
      (bVar1 = std::operator==(&lff->Arguments,&this->Args), bVar1)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmIfFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                       cmMakefile&)
{
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endif")) {
    // if the endif has arguments, then make sure
    // they match the arguments of the matching if
    if (lff.Arguments.empty() || lff.Arguments == this->Args) {
      return true;
    }
  }

  return false;
}